

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void explainAppendTerm(StrAccum *pStr,Index *pIdx,int nTerm,int iTerm,int bAnd,char *zOp)

{
  short sVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  ulong uVar6;
  
  if (bAnd != 0) {
    uVar2 = pStr->nChar;
    if (uVar2 + 5 < pStr->nAlloc) {
      pStr->nChar = uVar2 + 5;
      pcVar5 = pStr->zText;
      pcVar5[(ulong)uVar2 + 4] = ' ';
      builtin_strncpy(pcVar5 + uVar2," AND",4);
    }
    else {
      enlargeAndAppend(pStr," AND ",5);
    }
  }
  if (1 < nTerm) {
    uVar2 = pStr->nChar;
    uVar3 = uVar2 + 1;
    if (uVar3 < pStr->nAlloc) {
      pStr->nChar = uVar3;
      pStr->zText[uVar2] = '(';
    }
    else {
      enlargeAndAppend(pStr,"(",1);
    }
  }
  if (0 < nTerm) {
    uVar6 = 0;
    do {
      if (uVar6 != 0) {
        uVar2 = pStr->nChar;
        uVar3 = uVar2 + 1;
        if (uVar3 < pStr->nAlloc) {
          pStr->nChar = uVar3;
          pStr->zText[uVar2] = ',';
        }
        else {
          enlargeAndAppend(pStr,",",1);
        }
      }
      sVar1 = pIdx->aiColumn[(long)iTerm + uVar6];
      pcVar5 = "<expr>";
      if (sVar1 != -2) {
        if (sVar1 == -1) {
          pcVar5 = "rowid";
        }
        else {
          pcVar5 = pIdx->pTable->aCol[sVar1].zName;
        }
      }
      sqlite3_str_appendall(pStr,pcVar5);
      uVar6 = uVar6 + 1;
    } while ((uint)nTerm != uVar6);
  }
  uVar2 = pStr->nChar;
  uVar3 = uVar2 + 1;
  if (nTerm < 2) {
    if (uVar3 < pStr->nAlloc) {
      pStr->nChar = uVar3;
      pStr->zText[uVar2] = *zOp;
      goto LAB_0018ebca;
    }
  }
  else {
    if (uVar3 < pStr->nAlloc) {
      pStr->nChar = uVar3;
      pStr->zText[uVar2] = ')';
    }
    else {
      enlargeAndAppend(pStr,")",1);
    }
    uVar2 = pStr->nChar;
    uVar3 = uVar2 + 1;
    if (uVar3 < pStr->nAlloc) {
      pStr->nChar = uVar3;
      pStr->zText[uVar2] = *zOp;
    }
    else {
      enlargeAndAppend(pStr,zOp,1);
    }
    uVar2 = pStr->nChar;
    uVar3 = uVar2 + 1;
    if (uVar3 < pStr->nAlloc) {
      pStr->nChar = uVar3;
      pStr->zText[uVar2] = '(';
      goto LAB_0018ebca;
    }
    zOp = "(";
  }
  enlargeAndAppend(pStr,zOp,1);
LAB_0018ebca:
  if (0 < nTerm) {
    iVar4 = 0;
    do {
      if (iVar4 != 0) {
        uVar2 = pStr->nChar;
        uVar3 = uVar2 + 1;
        if (uVar3 < pStr->nAlloc) {
          pStr->nChar = uVar3;
          pStr->zText[uVar2] = ',';
        }
        else {
          enlargeAndAppend(pStr,",",1);
        }
      }
      uVar2 = pStr->nChar;
      uVar3 = uVar2 + 1;
      if (uVar3 < pStr->nAlloc) {
        pStr->nChar = uVar3;
        pStr->zText[uVar2] = '?';
      }
      else {
        enlargeAndAppend(pStr,"?",1);
      }
      iVar4 = iVar4 + 1;
    } while (nTerm != iVar4);
  }
  if (1 < nTerm) {
    uVar2 = pStr->nChar;
    uVar3 = uVar2 + 1;
    if (pStr->nAlloc <= uVar3) {
      enlargeAndAppend(pStr,")",1);
      return;
    }
    pStr->nChar = uVar3;
    pStr->zText[uVar2] = ')';
  }
  return;
}

Assistant:

static void explainAppendTerm(
  StrAccum *pStr,             /* The text expression being built */
  Index *pIdx,                /* Index to read column names from */
  int nTerm,                  /* Number of terms */
  int iTerm,                  /* Zero-based index of first term. */
  int bAnd,                   /* Non-zero to append " AND " */
  const char *zOp             /* Name of the operator */
){
  int i;

  assert( nTerm>=1 );
  if( bAnd ) sqlite3_str_append(pStr, " AND ", 5);

  if( nTerm>1 ) sqlite3_str_append(pStr, "(", 1);
  for(i=0; i<nTerm; i++){
    if( i ) sqlite3_str_append(pStr, ",", 1);
    sqlite3_str_appendall(pStr, explainIndexColumnName(pIdx, iTerm+i));
  }
  if( nTerm>1 ) sqlite3_str_append(pStr, ")", 1);

  sqlite3_str_append(pStr, zOp, 1);

  if( nTerm>1 ) sqlite3_str_append(pStr, "(", 1);
  for(i=0; i<nTerm; i++){
    if( i ) sqlite3_str_append(pStr, ",", 1);
    sqlite3_str_append(pStr, "?", 1);
  }
  if( nTerm>1 ) sqlite3_str_append(pStr, ")", 1);
}